

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

boolean expire_gas_cloud(void *p1,void *p2)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)p1 + 0x54);
  if ((int)uVar1 >= 5) {
    *(uint *)((long)p1 + 0x54) = uVar1 >> 1;
    *(undefined2 *)((long)p1 + 0x30) = 2;
  }
  return (int)uVar1 < 5;
}

Assistant:

boolean expire_gas_cloud(void *p1, void *p2)
{
    struct region *reg;
    int damage;

    reg = (struct region *) p1;
    damage = reg->arg;

    /* If it was a thick cloud, it dissipates a little first */
    if (damage >= 5) {
	damage /= 2;		/* It dissipates, let's do less damage */
	reg->arg = damage;
	reg->ttl = 2;		/* Here's the trick : reset ttl */
	return FALSE;		/* THEN return FALSE, means "still there" */
    }
    return TRUE;		/* OK, it's gone, you can free it! */
}